

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void UpdateWindowInFocusOrderList(ImGuiWindow *window,bool just_created,ImGuiWindowFlags new_flags)

{
  int i;
  ImGuiWindow **ppIVar1;
  uint in_EDX;
  undefined1 in_SIL;
  long in_RDI;
  byte bVar2;
  bool bVar3;
  int n;
  bool child_flag_changed;
  bool new_is_explicit_child;
  ImGuiContext *g;
  ImGuiWindow **in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  ImGuiContext *pIVar4;
  undefined3 in_stack_fffffffffffffff4;
  uint uVar5;
  char cVar6;
  
  uVar5 = CONCAT13(in_SIL,in_stack_fffffffffffffff4) & 0x1ffffff;
  bVar2 = (in_EDX & 0x1000000) != 0;
  bVar3 = bVar2 != (*(byte *)(in_RDI + 0x97) & 1);
  cVar6 = (char)(uVar5 >> 0x18);
  if (((cVar6 == '\0') && (!bVar3)) || ((bool)bVar2)) {
    if (((cVar6 == '\0') && (bVar3)) && ((bool)bVar2)) {
      i = (int)*(short *)(in_RDI + 0xa0);
      pIVar4 = GImGui;
      while (i = i + 1, i < (pIVar4->WindowsFocusOrder).Size) {
        ppIVar1 = ImVector<ImGuiWindow_*>::operator[](&pIVar4->WindowsFocusOrder,i);
        (*ppIVar1)->FocusOrder = (*ppIVar1)->FocusOrder + -1;
      }
      ImVector<ImGuiWindow_*>::erase
                ((ImVector<ImGuiWindow_*> *)CONCAT44(uVar5,in_EDX),(ImGuiWindow **)pIVar4);
      *(undefined2 *)(in_RDI + 0xa0) = 0xffff;
    }
  }
  else {
    pIVar4 = GImGui;
    ImVector<ImGuiWindow_*>::push_back
              ((ImVector<ImGuiWindow_*> *)
               CONCAT17(bVar2,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffffe4,
                                                      in_stack_ffffffffffffffe0))),
               in_stack_ffffffffffffffd8);
    *(short *)(in_RDI + 0xa0) = (short)(pIVar4->WindowsFocusOrder).Size + -1;
  }
  *(byte *)(in_RDI + 0x97) = bVar2 & 1;
  return;
}

Assistant:

static void UpdateWindowInFocusOrderList(ImGuiWindow* window, bool just_created, ImGuiWindowFlags new_flags)
{
    ImGuiContext& g = *GImGui;

    const bool new_is_explicit_child = (new_flags & ImGuiWindowFlags_ChildWindow) != 0;
    const bool child_flag_changed = new_is_explicit_child != window->IsExplicitChild;
    if ((just_created || child_flag_changed) && !new_is_explicit_child)
    {
        IM_ASSERT(!g.WindowsFocusOrder.contains(window));
        g.WindowsFocusOrder.push_back(window);
        window->FocusOrder = (short)(g.WindowsFocusOrder.Size - 1);
    }
    else if (!just_created && child_flag_changed && new_is_explicit_child)
    {
        IM_ASSERT(g.WindowsFocusOrder[window->FocusOrder] == window);
        for (int n = window->FocusOrder + 1; n < g.WindowsFocusOrder.Size; n++)
            g.WindowsFocusOrder[n]->FocusOrder--;
        g.WindowsFocusOrder.erase(g.WindowsFocusOrder.Data + window->FocusOrder);
        window->FocusOrder = -1;
    }
    window->IsExplicitChild = new_is_explicit_child;
}